

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O2

void __thiscall AutoString::~AutoString(AutoString *this)

{
  if ((this->dontFree == false) && (this->data != (char *)0x0)) {
    free(this->data);
    this->data = (char *)0x0;
  }
  if (this->data_wide != (LPWSTR)0x0) {
    free(this->data_wide);
    this->data_wide = (LPWSTR)0x0;
  }
  return;
}

Assistant:

~AutoString()
    {
        // we need persistent source string
        // for externalArrayBuffer source
        // externalArrayBuffer finalize should
        // free this memory
        if (!dontFree && data != nullptr)
        {
            free(data);
            data = nullptr;
        }

        // Free this anyway.
        if (data_wide != nullptr)
        {
            free(data_wide);
            data_wide = nullptr;
        }
    }